

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactoredMMDPDiscrete.cpp
# Opt level: O2

void __thiscall FactoredMMDPDiscrete::Initialize2DBN(FactoredMMDPDiscrete *this)

{
  EmptyObservationProbFunctor of;
  BoundTransitionProbFunctor<FactoredMMDPDiscrete> tf;
  BoundScopeFunctor<FactoredMMDPDiscrete> sf;
  
  ConstructObservations(this);
  MADPComponentDiscreteObservations::SetInitialized
            (&(this->super_FactoredDecPOMDPDiscrete).
              super_MultiAgentDecisionProcessDiscreteFactoredStates._m_O,true);
  tf.super_TransitionProbFunctor._vptr_TransitionProbFunctor =
       (_func_int **)&PTR_operator___0061d128;
  sf.super_ScopeFunctor._vptr_ScopeFunctor = (_func_int **)&PTR_operator___0061d0f8;
  sf._m_func = 0x41;
  tf._m_func = 0x49;
  sf._24_8_ = 0;
  tf._24_8_ = 0;
  of.super_ObservationProbFunctor._m_isEmpty = true;
  of.super_ObservationProbFunctor._vptr_ObservationProbFunctor =
       (_func_int **)&PTR_operator___0061d050;
  tf._m_tf = this;
  sf._m_sf = this;
  MultiAgentDecisionProcessDiscreteFactoredStates::Initialize2DBN
            ((MultiAgentDecisionProcessDiscreteFactoredStates *)this,&sf.super_ScopeFunctor,
             &tf.super_TransitionProbFunctor,&of.super_ObservationProbFunctor);
  Initialize2DBNObservations(this);
  return;
}

Assistant:

void FactoredMMDPDiscrete::Initialize2DBN()
{
    // construct observations
    ConstructObservations();
    SetObservationsInitialized(true); // Note: joint indices are likely to break

    BoundScopeFunctor<FactoredMMDPDiscrete> sf(this,&FactoredMMDPDiscrete::SetScopes);
    BoundTransitionProbFunctor<FactoredMMDPDiscrete> tf(this,&FactoredMMDPDiscrete::ComputeTransitionProb);
    EmptyObservationProbFunctor of;
    
    MultiAgentDecisionProcessDiscreteFactoredStates::Initialize2DBN(sf, tf, of); 

    // above calls SetOScopes and initializes CPD vector for observation variables
    Initialize2DBNObservations(); // set actual CPDs
}